

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

App * __thiscall CLI::App::_get_fallthrough_parent(App *this)

{
  undefined8 uVar1;
  long in_RDI;
  string *in_stack_00000008;
  HorribleError *in_stack_00000010;
  App *fallthrough_parent;
  bool local_61;
  App *local_48;
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  if (*(long *)(in_RDI + 0x308) == 0) {
    uVar1 = __cxa_allocate_exception(0x38);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    HorribleError::HorribleError(in_stack_00000010,in_stack_00000008);
    __cxa_throw(uVar1,&HorribleError::typeinfo,HorribleError::~HorribleError);
  }
  local_48 = *(App **)(in_RDI + 0x308);
  while( true ) {
    local_61 = false;
    if (local_48->parent_ != (App *)0x0) {
      get_name_abi_cxx11_(local_48);
      local_61 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1c92ee
                      );
    }
    if (local_61 == false) break;
    local_48 = local_48->parent_;
  }
  return local_48;
}

Assistant:

CLI11_INLINE App *App::_get_fallthrough_parent() {
    if(parent_ == nullptr) {
        throw(HorribleError("No Valid parent"));
    }
    auto *fallthrough_parent = parent_;
    while((fallthrough_parent->parent_ != nullptr) && (fallthrough_parent->get_name().empty())) {
        fallthrough_parent = fallthrough_parent->parent_;
    }
    return fallthrough_parent;
}